

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O0

void water_friction(schar *udx,schar *udy)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  boolean eff;
  int dy;
  int dx;
  int y;
  int x;
  schar *udy_local;
  schar *udx_local;
  
  bVar5 = false;
  if (((((u.uprops[0x39].intrinsic != 0) || (u.uprops[0x39].extrinsic != 0)) ||
       (((youmonst.data)->mflags1 & 2) != 0)) ||
      ((u.usteed != (monst *)0x0 && (((u.usteed)->data->mflags1 & 2) != 0)))) &&
     (iVar2 = rn2(4), iVar2 != 0)) {
    return;
  }
  if (*udx != '\0') {
    iVar2 = 6;
    if (*udy == '\0') {
      iVar2 = 3;
    }
    iVar2 = rn2(iVar2);
    if (iVar2 == 0) {
      iVar2 = (int)u.ux;
      do {
        iVar3 = rn2(3);
        iVar3 = iVar3 + -1;
        iVar4 = u.uy + iVar3;
        bVar5 = false;
        if ((((iVar3 != 0) && (bVar5 = true, 0 < iVar2)) && (bVar5 = true, iVar2 < 0x50)) &&
           ((bVar5 = true, -1 < iVar4 && (bVar5 = true, iVar4 < 0x15)))) {
          bVar1 = is_pool(level,iVar2,iVar4);
          bVar5 = bVar1 == '\0';
        }
      } while (bVar5);
      *udx = '\0';
      *udy = (schar)iVar3;
      bVar5 = true;
      goto LAB_0023bf83;
    }
  }
  if (*udy != '\0') {
    iVar2 = 5;
    if (*udx == '\0') {
      iVar2 = 3;
    }
    iVar2 = rn2(iVar2);
    if (iVar2 == 0) {
      iVar2 = (int)u.uy;
      do {
        iVar3 = rn2(3);
        iVar3 = iVar3 + -1;
        iVar4 = u.ux + iVar3;
        bVar5 = false;
        if (((iVar3 != 0) && (bVar5 = true, 0 < iVar4)) &&
           ((bVar5 = true, iVar4 < 0x50 &&
            ((bVar5 = true, -1 < iVar2 && (bVar5 = true, iVar2 < 0x15)))))) {
          bVar1 = is_pool(level,iVar4,iVar2);
          bVar5 = bVar1 == '\0';
        }
      } while (bVar5);
      *udy = '\0';
      *udx = (schar)iVar3;
      bVar5 = true;
    }
  }
LAB_0023bf83:
  if (bVar5) {
    pline("Water turbulence affects your movements.");
  }
  return;
}

Assistant:

void water_friction(schar *udx, schar *udy)
{
	int x, y, dx, dy;
	boolean eff = FALSE;

	if (Swimming && rn2(4))
		return;		/* natural swimmers have advantage */

	if (*udx && !rn2(!*udy ? 3 : 6)) {	/* 1/3 chance or half that */
		/* cancel delta x and choose an arbitrary delta y value */
		x = u.ux;
		do {
		    dy = rn2(3) - 1;		/* -1, 0, 1 */
		    y = u.uy + dy;
		} while (dy && (!isok(x,y) || !is_pool(level, x,y)));
		*udx = 0;
		*udy = dy;
		eff = TRUE;
	} else if (*udy && !rn2(!*udx ? 3 : 5)) {	/* 1/3 or 1/5*(5/6) */
		/* cancel delta y and choose an arbitrary delta x value */
		y = u.uy;
		do {
		    dx = rn2(3) - 1;		/* -1 .. 1 */
		    x = u.ux + dx;
		} while (dx && (!isok(x,y) || !is_pool(level, x,y)));
		*udy = 0;
		*udx = dx;
		eff = TRUE;
	}
	if (eff) pline("Water turbulence affects your movements.");
}